

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbi_write_hdr(char *filename,int x,int y,int comp,float *data)

{
  FILE *__stream;
  void *__ptr;
  uint in_EDX;
  uint in_ESI;
  char *in_RDI;
  long in_R8;
  uchar *unaff_retaddr;
  uchar *scratch;
  FILE *f;
  int i;
  int local_2c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar1;
  
  if ((((int)in_EDX < 1) || ((int)in_ESI < 1)) || (in_R8 == 0)) {
    uVar1 = 0;
  }
  else {
    __stream = fopen(in_RDI,"wb");
    if (__stream != (FILE *)0x0) {
      __ptr = malloc((long)(int)(in_ESI << 2));
      fprintf(__stream,"#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n");
      fprintf(__stream,"EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n",(ulong)in_EDX,
              (ulong)in_ESI);
      for (local_2c = 0; local_2c < (int)in_EDX; local_2c = local_2c + 1) {
        stbiw__write_hdr_scanline
                  (f,scratch._4_4_,(int)scratch,unaff_retaddr,
                   (float *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      }
      free(__ptr);
      fclose(__stream);
    }
    uVar1 = (uint)(__stream != (FILE *)0x0);
  }
  return uVar1;
}

Assistant:

int stbi_write_hdr(char const *filename, int x, int y, int comp, const float *data)
{
   int i;
   FILE *f;
   if (y <= 0 || x <= 0 || data == NULL) return 0;
   f = fopen(filename, "wb");
   if (f) {
      /* Each component is stored separately. Allocate scratch space for full output scanline. */
      unsigned char *scratch = (unsigned char *) STBIW_MALLOC(x*4);
      fprintf(f, "#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n"      );
      fprintf(f, "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n"                 , y, x);
      for(i=0; i < y; i++)
         stbiw__write_hdr_scanline(f, x, comp, scratch, data + comp*i*x);
      STBIW_FREE(scratch);
      fclose(f);
   }
   return f != NULL;
}